

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrmapper.c
# Opt level: O3

_Bool addr_mapper_peekaddr(addr_mapper *m,in_addr *nextaddr)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (m->curaddr).s_addr + 1;
  uVar2 = ((m->baseaddr).s_addr ^ uVar1) & (m->netmask).s_addr;
  if (uVar2 == 0) {
    nextaddr->s_addr = uVar1;
  }
  return uVar2 == 0;
}

Assistant:

bool addr_mapper_peekaddr(struct addr_mapper * m, struct in_addr * nextaddr)
{
  struct in_addr addr;
  addr.s_addr = m->curaddr.s_addr + 1;
  if (addr_in_range(addr, m->baseaddr, m->netmask))
  {
    nextaddr->s_addr = addr.s_addr;
    return true;
  }
  return false;
}